

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool __thiscall
Lodtalk::MethodSemanticAnalysis::optimizeMessage
          (MethodSemanticAnalysis *this,MessageSendNode *node,CompilerOptimizedSelector selectorId)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *node_00;
  int iVar3;
  Node *node_01;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__x;
  bool bVar4;
  Node *startValue;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> arguments;
  
  node_01 = AST::MessageSendNode::getReceiver(node);
  __x = AST::MessageSendNode::getArguments(node);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector(&arguments,__x);
  switch(selectorId) {
  case IfTrue:
  case IfFalse:
  case IfNil:
  case IfNotNil:
    pNVar1 = *arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (*node_01->_vptr_Node[2])(node_01,this);
    bVar4 = true;
    inlineBlock(this,pNVar1,0);
    goto LAB_00144261;
  case IfTrueIfFalse:
  case IfFalseIfTrue:
  case IfNilIfNotNil:
  case IfNotNilIfNil:
    pNVar1 = *arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = arguments.
             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[1];
    (*node_01->_vptr_Node[2])(node_01,this);
    inlineBlock(this,pNVar1,0);
    bVar4 = true;
    inlineBlock(this,pNVar2,0);
    goto LAB_00144261;
  case WhileTrue:
  case WhileFalse:
    iVar3 = (*node_01->_vptr_Node[5])(node_01);
    if ((char)iVar3 != '\0') {
      pNVar1 = *arguments.
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      inlineBlock(this,node_01,0);
      bVar4 = true;
      inlineBlock(this,pNVar1,0);
      goto LAB_00144261;
    }
    break;
  default:
    fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
            "bool Lodtalk::MethodSemanticAnalysis::optimizeMessage(MessageSendNode *, CompilerOptimizedSelector)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
            ,0x38c);
    abort();
  case ToByDo:
    pNVar1 = *arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = arguments.
             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[1];
    node_00 = arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start[2];
    iVar3 = (*node_00->_vptr_Node[5])(node_00);
    if ((char)iVar3 != '\0') {
      (*node_01->_vptr_Node[2])(node_01,this);
      (*pNVar1->_vptr_Node[2])(pNVar1,this);
      (*pNVar2->_vptr_Node[2])(pNVar2,this);
      bVar4 = true;
      inlineBlock(this,node_00,1);
      goto LAB_00144261;
    }
    break;
  case ToDo:
    pNVar1 = *arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = arguments.
             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl
             .super__Vector_impl_data._M_start[1];
    iVar3 = (*pNVar2->_vptr_Node[5])(pNVar2);
    if ((char)iVar3 != '\0') {
      (*node_01->_vptr_Node[2])(node_01,this);
      (*pNVar1->_vptr_Node[2])(pNVar1,this);
      bVar4 = true;
      inlineBlock(this,pNVar2,1);
      goto LAB_00144261;
    }
  }
  bVar4 = false;
LAB_00144261:
  std::_Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~_Vector_base
            (&arguments.
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>);
  return bVar4;
}

Assistant:

bool MethodSemanticAnalysis::optimizeMessage(MessageSendNode *node, CompilerOptimizedSelector selectorId)
{
    auto receiver = node->getReceiver();
    auto arguments = node->getArguments();

    switch(selectorId)
    {
    case CompilerOptimizedSelector::IfTrue:
    case CompilerOptimizedSelector::IfFalse:
    case CompilerOptimizedSelector::IfNil:
    case CompilerOptimizedSelector::IfNotNil:
        {
            auto thenBlock = arguments[0];
            receiver->acceptVisitor(this);
            inlineBlock(thenBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::IfTrueIfFalse:
    case CompilerOptimizedSelector::IfFalseIfTrue:
    case CompilerOptimizedSelector::IfNotNilIfNil:
    case CompilerOptimizedSelector::IfNilIfNotNil:

        {
            auto thenBlock = arguments[0];
            auto elseBlock = arguments[1];
            receiver->acceptVisitor(this);
            inlineBlock(thenBlock, 0);
            inlineBlock(elseBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::WhileTrue:
    case CompilerOptimizedSelector::WhileFalse:
        {
            if(!receiver->isBlockExpression())
                return false;
            auto conditionBlock = receiver;
            auto bodyBlock = arguments[0];
            inlineBlock(conditionBlock, 0);
            inlineBlock(bodyBlock, 0);
        }
        break;
    case CompilerOptimizedSelector::ToDo:
        {
            auto startValue = receiver;
            auto stopValue = arguments[0];
            auto bodyBlock = arguments[1];
            if(!bodyBlock->isBlockExpression())
                return false;

            startValue->acceptVisitor(this);
            stopValue->acceptVisitor(this);
            inlineBlock(bodyBlock, 1);
        }
        break;
    case CompilerOptimizedSelector::ToByDo:
        {
            auto startValue = receiver;
            auto stopValue = arguments[0];
            auto stepValue = arguments[1];
            auto bodyBlock = arguments[2];
            if(!bodyBlock->isBlockExpression())
                return false;

            startValue->acceptVisitor(this);
            stopValue->acceptVisitor(this);
            stepValue->acceptVisitor(this);
            inlineBlock(bodyBlock, 1);
        }
        break;
    default:
        LODTALK_UNIMPLEMENTED();
    }

    return true;
}